

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::ARTCorrectnessTest,_testing::internal::TemplateSel<(anonymous_namespace)::ARTCorrectnessTest_Clear_Test>,_testing::internal::Types<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  ulong *puVar1;
  undefined1 *__dest;
  pointer pcVar2;
  _Alloc_hider _Var3;
  uint *puVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  TestFactoryBase *pTVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  size_t sVar12;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *ptVar13;
  undefined4 in_register_00000084;
  long lVar14;
  char *pcVar15;
  type_info *ptVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *pcVar19;
  uint *puVar20;
  string local_3b8;
  CodeLocation local_398;
  uint *local_370;
  type_info *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  CodeLocation local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  uint *local_268;
  type_info *local_260;
  uint local_258;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined8 uStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  type_info *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  type_info *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  type_info *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  int local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  type_info *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  int local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  CodeLocation local_158;
  CodeLocation *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  CodeLocation local_120;
  string local_f8;
  CodeLocation local_d8;
  string local_b0;
  int local_90;
  GTestLog local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_130 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"","",test_names,CONCAT44(in_register_00000084,index));
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_120.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_120.file,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_d8.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8.file,*(char **)(pcVar2 + 0x20),*(size_type *)(pcVar2 + 0x28));
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_2f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_2f0._M_dataplus._M_p = (pointer)paVar11;
  }
  local_2f0._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"Clear","");
  local_158.file._M_dataplus._M_p = (pointer)local_1c0;
  ptVar13 = extraout_RDX;
  if (local_1b8 != (type_info *)0x0) {
    ptVar16 = local_1b8 + (long)local_1c0;
    do {
      paVar11 = local_1c0;
      iVar8 = isspace((uint)(byte)ptVar16[-1]);
      local_158.file._M_dataplus._M_p = (pointer)paVar11;
      ptVar13 = extraout_RDX_00;
      if (iVar8 == 0) break;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar16 + -1);
      lVar14 = (long)paVar17 - (long)paVar11;
      if ((local_1b8 != (type_info *)(lVar14 + 1)) &&
         (sVar12 = (long)local_1b8 - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_1c0->_M_local_buf + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_1c0->_M_local_buf + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = local_1b8 + -1;
      ((type_info *)(local_1c0->_M_local_buf + -1))[(long)local_1b8] = (type_info)0x0;
      ptVar16 = (type_info *)(local_1c0->_M_local_buf + lVar14);
      local_158.file._M_dataplus._M_p = (pointer)local_1c0;
      local_1b8 = ptVar13;
    } while (paVar17 != paVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.file._M_dataplus._M_p == &local_1b0) {
    local_158.file.field_2._8_8_ = local_1b0._8_8_;
    local_158.file._M_dataplus._M_p = (pointer)&local_158.file.field_2;
  }
  local_158.file.field_2._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
  local_158.file.field_2._M_local_buf[0] = local_1b0._M_local_buf[0];
  local_158.file._M_string_length = (size_type)local_1b8;
  local_1b8 = (type_info *)0x0;
  local_1b0._M_local_buf[0] = '\0';
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.file._M_dataplus._M_p;
  local_1c0 = &local_1b0;
  GetTypeName_abi_cxx11_
            (&local_b0,
             (internal *)
             &unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar13);
  _Var3._M_p = local_b0._M_dataplus._M_p;
  local_398.file._M_dataplus._M_p = (pointer)&local_398.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar8 = *(int *)(prefix + 0x20);
  pcVar15 = *(char **)prefix;
  local_398.line = iVar8;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar15 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_2d0);
  }
  pcVar15 = *(char **)prefix;
  iVar8 = *(int *)(prefix + 0x20);
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar15 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_2d0);
  }
  pTVar10 = (TestFactoryBase *)operator_new(8);
  pTVar10->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002ff008;
  MakeAndRegisterTestInfo
            (&local_2f0,local_128->_M_local_buf,_Var3._M_p,(char *)0x0,&local_398,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.file._M_dataplus._M_p != &local_398.file.field_2) {
    operator_delete(local_398.file._M_dataplus._M_p,local_398.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.file._M_dataplus._M_p != &local_158.file.field_2) {
    operator_delete(local_158.file._M_dataplus._M_p,local_158.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,
                    CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
    operator_delete(local_d8.file._M_dataplus._M_p,local_d8.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
    operator_delete(local_120.file._M_dataplus._M_p,local_120.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = &local_1d8;
  puVar1 = (ulong *)(prefix + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)prefix ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_1d8._M_allocated_capacity = *puVar1;
    local_1d8._8_8_ = *(undefined8 *)(prefix + 0x18);
  }
  else {
    local_1d8._M_allocated_capacity = *puVar1;
    local_1e8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)prefix;
  }
  local_1e0 = *(size_type *)(prefix + 8);
  *(ulong **)prefix = puVar1;
  prefix[8] = '\0';
  prefix[9] = '\0';
  prefix[10] = '\0';
  prefix[0xb] = '\0';
  prefix[0xc] = '\0';
  prefix[0xd] = '\0';
  prefix[0xe] = '\0';
  prefix[0xf] = '\0';
  prefix[0x10] = '\0';
  local_1c8 = *(int *)(prefix + 0x20);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_120.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_120.file,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_d8.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8.file,*(char **)(pcVar2 + 0x40),*(size_type *)(pcVar2 + 0x48));
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_310.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_310.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_310._M_dataplus._M_p = (pointer)paVar11;
  }
  local_310._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_208 = &local_1f8;
  local_1f8._M_allocated_capacity._0_4_ = 0x61656c43;
  local_1f8._M_allocated_capacity._4_2_ = 0x72;
  local_200 = (type_info *)0x5;
  pcVar15 = local_1f8._M_local_buf + 5;
  do {
    paVar11 = local_208;
    iVar8 = isspace((uint)(byte)pcVar15[-1]);
    paVar17 = paVar11;
    ptVar13 = extraout_RDX_01;
    if (iVar8 == 0) break;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar15 + -1);
    lVar14 = (long)paVar18 - (long)paVar11;
    if ((local_200 != (type_info *)(lVar14 + 1)) &&
       (sVar12 = (long)local_200 - (lVar14 + 1), sVar12 != 0)) {
      pcVar15 = local_208->_M_local_buf + lVar14;
      if (sVar12 == 1) {
        *pcVar15 = pcVar15[1];
      }
      else {
        memmove(pcVar15,local_208->_M_local_buf + lVar14 + 1,sVar12);
      }
    }
    ptVar16 = local_200;
    ptVar13 = local_200 + -1;
    local_200 = ptVar13;
    (local_208->_M_local_buf + -1)[(long)ptVar16] = '\0';
    pcVar15 = local_208->_M_local_buf + lVar14;
    paVar17 = local_208;
  } while (paVar18 != paVar11);
  local_158.file._M_dataplus._M_p = (pointer)paVar17;
  if (paVar17 == &local_1f8) {
    local_158.file.field_2._8_8_ = local_1f8._8_8_;
    local_158.file._M_dataplus._M_p = (pointer)&local_158.file.field_2;
  }
  local_158.file.field_2._M_allocated_capacity._4_2_ = local_1f8._M_allocated_capacity._4_2_;
  local_158.file.field_2._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_;
  local_158.file.field_2._M_allocated_capacity._6_2_ = local_1f8._M_allocated_capacity._6_2_;
  local_158.file._M_string_length = (size_type)local_200;
  local_200 = (type_info *)0x0;
  local_1f8._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.file._M_dataplus._M_p;
  local_208 = &local_1f8;
  GetTypeName_abi_cxx11_
            (&local_b0,
             (internal *)
             &unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar13);
  _Var3._M_p = local_b0._M_dataplus._M_p;
  local_2d0.file._M_dataplus._M_p = (pointer)&local_2d0.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_1e8,local_1e0 + (long)local_1e8);
  iVar8 = local_1c8;
  paVar11 = local_1e8;
  local_2d0.line = local_1c8;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_1a0);
  }
  iVar8 = local_1c8;
  paVar11 = local_1e8;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_1a0);
  }
  pTVar10 = (TestFactoryBase *)operator_new(8);
  pTVar10->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002ff0a0;
  MakeAndRegisterTestInfo
            (&local_310,local_128->_M_local_buf,_Var3._M_p,(char *)0x0,&local_2d0,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.file._M_dataplus._M_p != &local_2d0.file.field_2) {
    operator_delete(local_2d0.file._M_dataplus._M_p,local_2d0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.file._M_dataplus._M_p != &local_158.file.field_2) {
    operator_delete(local_158.file._M_dataplus._M_p,local_158.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,
                    CONCAT26(local_1f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_1f8._M_allocated_capacity._4_2_,
                                      local_1f8._M_allocated_capacity._0_4_)) + 1);
  }
  paVar11 = &local_120.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
    operator_delete(local_d8.file._M_dataplus._M_p,local_d8.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.file._M_dataplus._M_p != paVar11) {
    operator_delete(local_120.file._M_dataplus._M_p,local_120.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1a0 = &local_190;
  if (local_1e8 == &local_1d8) {
    local_190._8_8_ = local_1d8._8_8_;
  }
  else {
    local_1a0 = local_1e8;
  }
  local_190._M_allocated_capacity = local_1d8._M_allocated_capacity;
  local_198 = local_1e0;
  local_1e0 = 0;
  local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
  local_180 = local_1c8;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1e8 = &local_1d8;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_120.file._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.file._M_dataplus._M_p == paVar17) {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_120.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_120.file._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_120.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_120.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_120.file,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_d8.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8.file,*(char **)(pcVar2 + 0x60),*(size_type *)(pcVar2 + 0x68));
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_330.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_330.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_330.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_330._M_dataplus._M_p = (pointer)paVar11;
  }
  local_330._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_228 = &local_218;
  local_218._M_allocated_capacity._0_4_ = 0x61656c43;
  local_218._M_allocated_capacity._4_2_ = 0x72;
  local_220 = (type_info *)0x5;
  pcVar15 = local_218._M_local_buf + 5;
  do {
    paVar11 = local_228;
    iVar8 = isspace((uint)(byte)pcVar15[-1]);
    local_b0._M_dataplus._M_p = (pointer)paVar11;
    ptVar13 = extraout_RDX_02;
    if (iVar8 == 0) break;
    pcVar19 = pcVar15 + -1;
    lVar14 = (long)pcVar19 - (long)paVar11;
    if ((local_220 != (type_info *)(lVar14 + 1)) &&
       (sVar12 = (long)local_220 - (lVar14 + 1), sVar12 != 0)) {
      pcVar15 = local_228->_M_local_buf + lVar14;
      if (sVar12 == 1) {
        *pcVar15 = pcVar15[1];
      }
      else {
        memmove(pcVar15,local_228->_M_local_buf + lVar14 + 1,sVar12);
      }
    }
    ptVar16 = local_220;
    ptVar13 = local_220 + -1;
    local_220 = ptVar13;
    (local_228->_M_local_buf + -1)[(long)ptVar16] = '\0';
    pcVar15 = local_228->_M_local_buf + lVar14;
    local_b0._M_dataplus._M_p = (pointer)local_228;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar19 != paVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_218) {
    local_b0.field_2._8_8_ = local_218._8_8_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  local_b0.field_2._M_allocated_capacity._4_2_ = local_218._M_allocated_capacity._4_2_;
  local_b0.field_2._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_;
  local_b0.field_2._M_allocated_capacity._6_2_ = local_218._M_allocated_capacity._6_2_;
  local_b0._M_string_length = (size_type)local_220;
  local_220 = (type_info *)0x0;
  local_218._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_ & 0xffffff00;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p;
  local_228 = &local_218;
  GetTypeName_abi_cxx11_
            (&local_f8,
             (internal *)
             &unodb::
              db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var3._M_p = local_f8._M_dataplus._M_p;
  local_158.file._M_dataplus._M_p = (pointer)&local_158.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_1a0,local_198 + (long)local_1a0);
  iVar8 = local_180;
  paVar11 = local_1a0;
  local_158.line = local_180;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_178);
  }
  iVar8 = local_180;
  paVar11 = local_1a0;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_178);
  }
  pTVar10 = (TestFactoryBase *)operator_new(8);
  pTVar10->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002ff138;
  MakeAndRegisterTestInfo
            (&local_330,local_128->_M_local_buf,_Var3._M_p,(char *)0x0,&local_158,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.file._M_dataplus._M_p != &local_158.file.field_2) {
    operator_delete(local_158.file._M_dataplus._M_p,local_158.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,
                    CONCAT26(local_218._M_allocated_capacity._6_2_,
                             CONCAT24(local_218._M_allocated_capacity._4_2_,
                                      local_218._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
    operator_delete(local_d8.file._M_dataplus._M_p,local_d8.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
    operator_delete(local_120.file._M_dataplus._M_p,local_120.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (local_1a0 == &local_190) {
    local_b0.field_2._8_8_ = local_190._8_8_;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)local_1a0;
  }
  local_b0.field_2._M_allocated_capacity = local_190._M_allocated_capacity;
  local_b0._M_string_length = local_198;
  local_198 = 0;
  local_190._M_allocated_capacity = local_190._M_allocated_capacity & 0xffffffffffffff00;
  local_90 = local_180;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity =
       local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1a0 = &local_190;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_f8,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_58.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar11;
  }
  local_58._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_d8.file.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d8.file._M_dataplus._M_p = (pointer)paVar11;
  }
  local_d8.file._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_d8.file,*(char **)(pcVar2 + 0x80),*(size_type *)(pcVar2 + 0x88));
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_350.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_350.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_350.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_350._M_dataplus._M_p = (pointer)paVar11;
  }
  local_350._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_248 = &local_238;
  local_238._M_allocated_capacity._0_4_ = 0x61656c43;
  local_238._M_allocated_capacity._4_2_ = 0x72;
  local_240 = (type_info *)0x5;
  pcVar15 = local_238._M_local_buf + 5;
  do {
    paVar11 = local_248;
    iVar8 = isspace((uint)(byte)pcVar15[-1]);
    local_178._M_dataplus._M_p = (pointer)paVar11;
    ptVar13 = extraout_RDX_03;
    if (iVar8 == 0) break;
    pcVar19 = pcVar15 + -1;
    lVar14 = (long)pcVar19 - (long)paVar11;
    if ((local_240 != (type_info *)(lVar14 + 1)) &&
       (sVar12 = (long)local_240 - (lVar14 + 1), sVar12 != 0)) {
      pcVar15 = local_248->_M_local_buf + lVar14;
      if (sVar12 == 1) {
        *pcVar15 = pcVar15[1];
      }
      else {
        memmove(pcVar15,local_248->_M_local_buf + lVar14 + 1,sVar12);
      }
    }
    ptVar16 = local_240;
    ptVar13 = local_240 + -1;
    local_240 = ptVar13;
    (local_248->_M_local_buf + -1)[(long)ptVar16] = '\0';
    pcVar15 = local_248->_M_local_buf + lVar14;
    local_178._M_dataplus._M_p = (pointer)local_248;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar19 != paVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == &local_238) {
    local_178.field_2._8_8_ = local_238._8_8_;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  local_178.field_2._M_allocated_capacity._4_2_ = local_238._M_allocated_capacity._4_2_;
  local_178.field_2._M_allocated_capacity._0_4_ = local_238._M_allocated_capacity._0_4_;
  local_178.field_2._M_allocated_capacity._6_2_ = local_238._M_allocated_capacity._6_2_;
  local_178._M_string_length = (size_type)local_240;
  local_240 = (type_info *)0x0;
  local_238._M_allocated_capacity._0_4_ = local_238._M_allocated_capacity._0_4_ & 0xffffff00;
  local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p;
  local_248 = &local_238;
  GetTypeName_abi_cxx11_
            (&local_288,
             (internal *)
             &unodb::
              mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var3._M_p = local_288._M_dataplus._M_p;
  local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  iVar8 = local_90;
  _Var5._M_p = local_b0._M_dataplus._M_p;
  local_120.line = local_90;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_2a8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_2a8);
  }
  iVar8 = local_90;
  _Var5._M_p = local_b0._M_dataplus._M_p;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog((GTestLog *)&local_2a8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog((GTestLog *)&local_2a8);
  }
  pTVar10 = (TestFactoryBase *)operator_new(8);
  pTVar10->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002ff1d0;
  MakeAndRegisterTestInfo
            (&local_350,local_128->_M_local_buf,_Var3._M_p,(char *)0x0,&local_120,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
    operator_delete(local_120.file._M_dataplus._M_p,local_120.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,
                    CONCAT26(local_238._M_allocated_capacity._6_2_,
                             CONCAT24(local_238._M_allocated_capacity._4_2_,
                                      local_238._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
    operator_delete(local_d8.file._M_dataplus._M_p,local_d8.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    local_58.field_2._8_8_ = local_b0.field_2._8_8_;
  }
  else {
    local_58._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  }
  local_58.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
  local_58._M_string_length = local_b0._M_string_length;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_38 = local_90;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,"");
  local_288._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
  paVar11 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p == paVar11) {
    local_288.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_288._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"ARTCorrectnessTest");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_178.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_178._M_dataplus._M_p = (pointer)paVar11;
  }
  local_178._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_178,"/");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_80,*(char **)(pcVar2 + 0xa0),*(size_type *)(pcVar2 + 0xa8));
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar9->_M_dataplus)._M_p;
  paVar17 = &pbVar9->field_2;
  if (paVar11 == paVar17) {
    local_f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)paVar11;
    local_f8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_f8._M_string_length = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  local_258 = 0x61656c43;
  uStack_254 = 0x72;
  local_260 = (type_info *)0x5;
  lVar14 = (long)&uStack_254 + 1;
  local_268 = &local_258;
  do {
    puVar4 = local_268;
    iVar8 = isspace((uint)*(byte *)(lVar14 + -1));
    local_370 = puVar4;
    ptVar13 = extraout_RDX_04;
    if (iVar8 == 0) break;
    puVar20 = (uint *)(lVar14 + -1);
    lVar14 = (long)puVar20 - (long)puVar4;
    if ((local_260 != (type_info *)(lVar14 + 1)) &&
       (sVar12 = (long)local_260 - (lVar14 + 1), sVar12 != 0)) {
      __dest = (undefined1 *)((long)local_268 + lVar14);
      if (sVar12 == 1) {
        *__dest = __dest[1];
      }
      else {
        memmove(__dest,(void *)((long)local_268 + lVar14 + 1),sVar12);
      }
    }
    ptVar13 = local_260 + -1;
    local_260[(long)local_268 + -1] = (type_info)0x0;
    lVar14 = (long)local_268 + lVar14;
    local_370 = local_268;
    local_260 = ptVar13;
  } while (puVar20 != puVar4);
  if (local_370 == &local_258) {
    uStack_358 = uStack_250;
    local_370 = (uint *)&local_360;
  }
  local_360 = CONCAT26(uStack_252,CONCAT24(uStack_254,local_258));
  local_368 = local_260;
  local_260 = (type_info *)0x0;
  local_258 = local_258 & 0xffffff00;
  local_130 = (CodeLocation *)local_370;
  local_268 = &local_258;
  GetTypeName_abi_cxx11_
            (&local_3b8,
             (internal *)
             &unodb::
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var3._M_p = local_3b8._M_dataplus._M_p;
  local_d8.file._M_dataplus._M_p = (pointer)&local_d8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  iVar8 = local_38;
  _Var5._M_p = local_58._M_dataplus._M_p;
  local_d8.line = local_38;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog(&local_84);
  }
  iVar8 = local_38;
  _Var5._M_p = local_58._M_dataplus._M_p;
  bVar7 = IsTrue(true);
  if (!bVar7) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar8);
    GTestLog::~GTestLog(&local_84);
  }
  pTVar10 = (TestFactoryBase *)operator_new(8);
  pTVar10->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002ff268;
  MakeAndRegisterTestInfo
            (&local_f8,(char *)local_130,_Var3._M_p,(char *)0x0,&local_d8,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.file._M_dataplus._M_p != &local_d8.file.field_2) {
    operator_delete(local_d8.file._M_dataplus._M_p,local_d8.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_370 != (uint *)&local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT26(uStack_252,CONCAT24(uStack_254,local_258)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  uVar6 = local_58.field_2._M_allocated_capacity;
  paVar11 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar11) {
    local_80.field_2._8_8_ = local_58.field_2._8_8_;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  local_80.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_80._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_60 = local_38;
  local_58._M_dataplus._M_p = (pointer)paVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,uVar6 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190._M_allocated_capacity + 1);
  }
  paVar11 = &local_1d8;
  if (local_1e8 != paVar11) {
    operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
    paVar11 = extraout_RAX;
  }
  return SUB81(paVar11,0);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }